

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack16.h
# Opt level: O1

void ncnn::convdw5x5s2_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined1 (*pauVar8) [64];
  void *pvVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  void *pvVar14;
  long lVar15;
  void *pvVar16;
  long lVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  
  iVar1 = bottom_blob->c;
  if (0 < (long)iVar1) {
    iVar2 = top_blob->w;
    iVar3 = top_blob->h;
    pvVar4 = _bias->data;
    lVar12 = (long)((bottom_blob->w - iVar2) * 0x20);
    lVar10 = 0;
    do {
      if (pvVar4 == (void *)0x0) {
        auVar19 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
        auVar19 = *(undefined1 (*) [64])((long)pvVar4 + lVar10 * 0x40);
      }
      if (0 < iVar3) {
        pauVar8 = (undefined1 (*) [64])
                  (top_blob->cstep * lVar10 * top_blob->elemsize + (long)top_blob->data);
        lVar17 = kernel->w * lVar10 * kernel->elemsize;
        pvVar5 = kernel->data;
        pvVar14 = (void *)(bottom_blob->cstep * lVar10 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        lVar15 = (long)bottom_blob->w * bottom_blob->elemsize;
        pvVar9 = (void *)((long)pvVar14 + lVar15 * 4);
        pvVar6 = (void *)(lVar15 * 3 + (long)pvVar14);
        pvVar7 = (void *)((long)pvVar14 + lVar15 * 2);
        pvVar16 = (void *)(lVar15 + (long)pvVar14);
        iVar13 = 0;
        do {
          if (0 < iVar2) {
            lVar15 = 0;
            iVar11 = iVar2;
            do {
              auVar18 = vfmadd132ps_avx512f(*(undefined1 (*) [64])((long)pvVar5 + lVar17),auVar19,
                                            *(undefined1 (*) [64])((long)pvVar14 + lVar15));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x40),
                                            *(undefined1 (*) [64])((long)pvVar14 + lVar15 + 0x40));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x80),
                                            *(undefined1 (*) [64])((long)pvVar14 + lVar15 + 0x80));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0xc0),
                                            *(undefined1 (*) [64])((long)pvVar14 + lVar15 + 0xc0));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x100),
                                            *(undefined1 (*) [64])((long)pvVar14 + lVar15 + 0x100));
              auVar18 = vfmadd132ps_avx512f(*(undefined1 (*) [64])((long)pvVar5 + lVar17 + 0x140),
                                            auVar18,*(undefined1 (*) [64])((long)pvVar16 + lVar15));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x180),
                                            *(undefined1 (*) [64])((long)pvVar16 + lVar15 + 0x40));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x1c0),
                                            *(undefined1 (*) [64])((long)pvVar16 + lVar15 + 0x80));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x200),
                                            *(undefined1 (*) [64])((long)pvVar16 + lVar15 + 0xc0));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x240),
                                            *(undefined1 (*) [64])((long)pvVar16 + lVar15 + 0x100));
              auVar18 = vfmadd132ps_avx512f(*(undefined1 (*) [64])((long)pvVar5 + lVar17 + 0x280),
                                            auVar18,*(undefined1 (*) [64])((long)pvVar7 + lVar15));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x2c0),
                                            *(undefined1 (*) [64])((long)pvVar7 + lVar15 + 0x40));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x300),
                                            *(undefined1 (*) [64])((long)pvVar7 + lVar15 + 0x80));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x340),
                                            *(undefined1 (*) [64])((long)pvVar7 + lVar15 + 0xc0));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x380),
                                            *(undefined1 (*) [64])((long)pvVar7 + lVar15 + 0x100));
              auVar18 = vfmadd132ps_avx512f(*(undefined1 (*) [64])((long)pvVar5 + lVar17 + 0x3c0),
                                            auVar18,*(undefined1 (*) [64])((long)pvVar6 + lVar15));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x400),
                                            *(undefined1 (*) [64])((long)pvVar6 + lVar15 + 0x40));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x440),
                                            *(undefined1 (*) [64])((long)pvVar6 + lVar15 + 0x80));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x480),
                                            *(undefined1 (*) [64])((long)pvVar6 + lVar15 + 0xc0));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x4c0),
                                            *(undefined1 (*) [64])((long)pvVar6 + lVar15 + 0x100));
              auVar18 = vfmadd132ps_avx512f(*(undefined1 (*) [64])((long)pvVar5 + lVar17 + 0x500),
                                            auVar18,*(undefined1 (*) [64])((long)pvVar9 + lVar15));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x540),
                                            *(undefined1 (*) [64])((long)pvVar9 + lVar15 + 0x40));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x580),
                                            *(undefined1 (*) [64])((long)pvVar9 + lVar15 + 0x80));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x5c0),
                                            *(undefined1 (*) [64])((long)pvVar9 + lVar15 + 0xc0));
              auVar18 = vfmadd231ps_avx512f(auVar18,*(undefined1 (*) [64])
                                                     ((long)pvVar5 + lVar17 + 0x600),
                                            *(undefined1 (*) [64])((long)pvVar9 + lVar15 + 0x100));
              *pauVar8 = auVar18;
              pauVar8 = pauVar8 + 1;
              lVar15 = lVar15 + 0x80;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
            pvVar14 = (void *)((long)pvVar14 + lVar15);
            pvVar16 = (void *)((long)pvVar16 + lVar15);
            pvVar7 = (void *)((long)pvVar7 + lVar15);
            pvVar6 = (void *)((long)pvVar6 + lVar15);
            pvVar9 = (void *)((long)pvVar9 + lVar15);
          }
          pvVar14 = (void *)((long)pvVar14 + lVar12 * 4);
          pvVar16 = (void *)((long)pvVar16 + lVar12 * 4);
          pvVar7 = (void *)((long)pvVar7 + lVar12 * 4);
          pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar12 * 4);
          iVar13 = iVar13 + 1;
        } while (iVar13 != iVar3);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar1);
  }
  return;
}

Assistant:

static void convdw5x5s2_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 16;

    const float* bias = _bias;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m512 _bias0 = bias ? _mm512_loadu_ps((const float*)bias + g * 16) : _mm512_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m512 _sum0 = _bias0;

                __m512 _r00 = _mm512_load_ps(r0);
                __m512 _r01 = _mm512_load_ps(r0 + 16);
                __m512 _r02 = _mm512_load_ps(r0 + 32);
                __m512 _r03 = _mm512_load_ps(r0 + 48);
                __m512 _r04 = _mm512_load_ps(r0 + 64);

                __m512 _k00 = _mm512_load_ps(k0);
                __m512 _k01 = _mm512_load_ps(k0 + 16);
                __m512 _k02 = _mm512_load_ps(k0 + 32);
                __m512 _k03 = _mm512_load_ps(k0 + 48);
                __m512 _k04 = _mm512_load_ps(k0 + 64);
                k0 += 80;

                _sum0 = _mm512_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm512_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm512_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm512_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm512_fmadd_ps(_k04, _r04, _sum0);

                __m512 _r10 = _mm512_load_ps(r1);
                __m512 _r11 = _mm512_load_ps(r1 + 16);
                __m512 _r12 = _mm512_load_ps(r1 + 32);
                __m512 _r13 = _mm512_load_ps(r1 + 48);
                __m512 _r14 = _mm512_load_ps(r1 + 64);

                __m512 _k10 = _mm512_load_ps(k0);
                __m512 _k11 = _mm512_load_ps(k0 + 16);
                __m512 _k12 = _mm512_load_ps(k0 + 32);
                __m512 _k13 = _mm512_load_ps(k0 + 48);
                __m512 _k14 = _mm512_load_ps(k0 + 64);
                k0 += 80;

                _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm512_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm512_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm512_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm512_fmadd_ps(_k14, _r14, _sum0);

                __m512 _r20 = _mm512_load_ps(r2);
                __m512 _r21 = _mm512_load_ps(r2 + 16);
                __m512 _r22 = _mm512_load_ps(r2 + 32);
                __m512 _r23 = _mm512_load_ps(r2 + 48);
                __m512 _r24 = _mm512_load_ps(r2 + 64);

                __m512 _k20 = _mm512_load_ps(k0);
                __m512 _k21 = _mm512_load_ps(k0 + 16);
                __m512 _k22 = _mm512_load_ps(k0 + 32);
                __m512 _k23 = _mm512_load_ps(k0 + 48);
                __m512 _k24 = _mm512_load_ps(k0 + 64);
                k0 += 80;

                _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm512_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm512_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm512_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm512_fmadd_ps(_k24, _r24, _sum0);

                __m512 _r30 = _mm512_load_ps(r3);
                __m512 _r31 = _mm512_load_ps(r3 + 16);
                __m512 _r32 = _mm512_load_ps(r3 + 32);
                __m512 _r33 = _mm512_load_ps(r3 + 48);
                __m512 _r34 = _mm512_load_ps(r3 + 64);

                __m512 _k30 = _mm512_load_ps(k0);
                __m512 _k31 = _mm512_load_ps(k0 + 16);
                __m512 _k32 = _mm512_load_ps(k0 + 32);
                __m512 _k33 = _mm512_load_ps(k0 + 48);
                __m512 _k34 = _mm512_load_ps(k0 + 64);
                k0 += 80;

                _sum0 = _mm512_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm512_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm512_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm512_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm512_fmadd_ps(_k34, _r34, _sum0);

                __m512 _r40 = _mm512_load_ps(r4);
                __m512 _r41 = _mm512_load_ps(r4 + 16);
                __m512 _r42 = _mm512_load_ps(r4 + 32);
                __m512 _r43 = _mm512_load_ps(r4 + 48);
                __m512 _r44 = _mm512_load_ps(r4 + 64);

                __m512 _k40 = _mm512_load_ps(k0);
                __m512 _k41 = _mm512_load_ps(k0 + 16);
                __m512 _k42 = _mm512_load_ps(k0 + 32);
                __m512 _k43 = _mm512_load_ps(k0 + 48);
                __m512 _k44 = _mm512_load_ps(k0 + 64);
                k0 -= 320;

                _sum0 = _mm512_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm512_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm512_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm512_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm512_fmadd_ps(_k44, _r44, _sum0);

                _mm512_store_ps(outptr0, _sum0);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                r3 += 32;
                r4 += 32;
                outptr0 += 16;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
            r3 += tailstep;
            r4 += tailstep;
        }
    }
}